

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariables.cpp
# Opt level: O2

void __thiscall chrono::ChVariables::ChVariables(ChVariables *this,int m_ndof)

{
  int iVar1;
  
  this->_vptr_ChVariables = (_func_int **)&PTR__ChVariables_01150478;
  (this->qb).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->qb).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (this->fb).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->fb).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  this->ndof = m_ndof;
  this->disabled = false;
  this->offset = 0;
  if (0 < m_ndof) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
              (&(this->qb).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               (ulong)(uint)m_ndof);
    iVar1 = (*this->_vptr_ChVariables[2])(this);
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
              (&(this->fb).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               (long)iVar1);
  }
  return;
}

Assistant:

ChVariables::ChVariables(int m_ndof) : disabled(false), ndof(m_ndof), offset(0) {
    if (ndof > 0) {
        qb.setZero(Get_ndof());
        fb.setZero(Get_ndof());
    }
}